

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg,bool any_reparse)

{
  pointer *ppCVar1;
  int *piVar2;
  JsonLocation *pJVar3;
  anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
  *this_00;
  byte bVar4;
  undefined4 uVar5;
  pointer pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  MessageFactory MVar10;
  DescriptorPool *pDVar11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  MessageType MVar15;
  Field pFVar16;
  long lVar17;
  string *psVar18;
  size_type sVar19;
  Descriptor *pDVar20;
  Message *pMVar21;
  MessageLite *this_01;
  optional<unsigned_int> oVar22;
  optional<unsigned_int> oVar23;
  _Optional_payload_base<int> _Var24;
  optional<unsigned_int> oVar25;
  optional<unsigned_int> oVar26;
  optional<unsigned_int> oVar27;
  optional<int> oVar28;
  ulong uVar29;
  uint *out;
  char *pcVar30;
  ulong uVar31;
  int iVar32;
  char cVar33;
  string_view *this_02;
  undefined7 in_register_00000081;
  _Storage<unsigned_int,_true> _Var34;
  MessagePath *pMVar35;
  size_type __n;
  uint uVar36;
  int64_t x;
  optional<const_google::protobuf::FieldDescriptor_*> oVar37;
  string_view sVar38;
  Metadata MVar39;
  basic_string_view<char,_std::char_traits<char>_> bVar40;
  basic_string_view<char,_std::char_traits<char>_> bVar41;
  string_view literal;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  string_view literal_05;
  string_view str;
  string_view literal_06;
  string_view literal_07;
  string_view text;
  string_view prefix;
  string_view suffix;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view name_00;
  string_view prefix_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view x_00;
  string_view x_01;
  string_view x_02;
  string_view end;
  string_view end_00;
  string_view end_01;
  string_view end_02;
  string_view end_03;
  string_view end_04;
  string_view end_05;
  string_view end_06;
  undefined8 uStack_280;
  Status *_status;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> local_260;
  _Storage<unsigned_int,_true> local_258;
  char *local_248;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  bool local_1e8;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  size_t local_1d0;
  MessagePath *local_1c8;
  MessagePath *local_1c0;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key_1;
  string_view extn_name;
  undefined1 local_148 [32];
  bool local_128;
  MessagePath *local_120;
  string_view correct_type_name;
  DynamicMessageFactory factory;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  ArrayInputStream in;
  
  sVar38._M_str = (char *)desc;
  sVar38._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  pcVar30 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar15 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,sVar38);
  if ((int)(char *)CONCAT71(in_register_00000081,any_reparse) != 0) goto switchD_0028d2dd_caseD_3;
  if (MVar15 != kValue) {
    if (MVar15 == kStruct) {
      ParseStructValue<google::protobuf::json_internal::ParseProto2Descriptor>(this,lex,desc,msg);
      return (Status)(uintptr_t)this;
    }
    if (MVar15 != kAny) {
      bVar12 = JsonLexer::Peek(lex,kObj);
      if ((bVar12) && ((lex->options_).allow_legacy_syntax != false)) {
switchD_0028d2dd_caseD_3:
        JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
        if (*(long *)this != 1) {
          return (Status)(uintptr_t)this;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        JsonLexer::Push((JsonLexer *)this);
        if (*(long *)this != 1) {
          return (Status)(uintptr_t)this;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        literal._M_str = "}";
        literal._M_len = 1;
        bVar12 = JsonLexer::Peek(lex,literal);
        if (bVar12) {
          piVar2 = &(lex->options_).recursion_depth;
          *piVar2 = *piVar2 + 1;
        }
        else {
          pJVar3 = &lex->json_loc_;
          bVar12 = true;
          do {
            if (bVar12 == false) {
              pcVar30 = "expected \',\'";
              goto LAB_0028d8e7;
            }
            JsonLexer::SkipToToken((JsonLexer *)this);
            if (*(long *)this != 1) {
              return (Status)(uintptr_t)this;
            }
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr(&key);
            cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
            if ((cVar13 == '\"') ||
               (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
              JsonLexer::ParseUtf8
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&key_1.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,lex);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          ,&key_1.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         );
LAB_0028d390:
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData(&key_1.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             );
              absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
              if (*(long *)this != 1) goto LAB_0028d889;
              absl::lts_20240722::Status::~Status((Status *)this);
              JsonLexer::Expect((JsonLexer *)this,lex,1,":");
              if (*(long *)this != 1) goto LAB_0028d889;
              absl::lts_20240722::Status::~Status((Status *)this);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              if (any_reparse) {
                bVar14 = json_internal::operator==
                                   (&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1.data_.value,(char (*) [6])"@type");
                if (!bVar14) {
                  if (MVar15 == kNotWellKnown) goto LAB_0028d4c1;
                  bVar14 = json_internal::operator!=
                                     (&key.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       .field_1.data_.value,(char (*) [6])0x3b608b);
                  if (bVar14) {
                    JsonLocation::Invalid
                              ((JsonLocation *)this,pJVar3,0x37,
                               "fields in a well-known-typed Any must be @type or value");
                  }
                  else {
                    ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
                              (this,lex,desc,msg,false);
                  }
                  goto LAB_0028d85d;
                }
                JsonLexer::SkipValue((JsonLexer *)this);
                if (*(long *)this != 1) goto LAB_0028d889;
                absl::lts_20240722::Status::~Status((Status *)this);
                *(undefined8 *)this = 1;
              }
              else {
LAB_0028d4c1:
                psVar18 = MaybeOwnedString::ToString_abi_cxx11_
                                    (&key.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_1.data_.value);
                factory.pool_ = (DescriptorPool *)(psVar18->_M_dataplus)._M_p;
                factory.super_MessageFactory._vptr_MessageFactory =
                     (_func_int **)psVar18->_M_string_length;
                text._M_str = (char *)factory.pool_;
                text._M_len = (size_t)psVar18->_M_string_length;
                prefix._M_str = "[";
                prefix._M_len = 1;
                pcVar30 = "[";
                bVar14 = absl::lts_20240722::StartsWith(text,prefix);
                if (bVar14) {
                  suffix._M_str = "]";
                  suffix._M_len = 1;
                  pcVar30 = "]";
                  bVar14 = absl::lts_20240722::EndsWith((string_view)factory._0_16_,suffix);
                  if (!bVar14) goto LAB_0028d60e;
                  extn_name = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &factory,1,
                                         (long)factory.super_MessageFactory._vptr_MessageFactory - 2
                                        );
                  name._M_len = extn_name._M_str;
                  name._M_str = pcVar30;
                  oVar37 = Proto2Descriptor::ExtensionByName
                                     ((Proto2Descriptor *)desc,(Desc *)extn_name._M_len,name);
                  local_260 = oVar37.
                              super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>
                              ._M_payload;
                  uVar36 = oVar37.
                           super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
                           _8_4_;
                  if (((undefined1  [16])
                       oVar37.
                       super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*> &
                      (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0028d630;
                  correct_type_name._M_str = desc->all_names_[1]._M_dataplus._M_p;
                  correct_type_name._M_len = desc->all_names_[1]._M_string_length;
                  psVar18 = (local_260._M_value)->containing_type_->all_names_;
                  bVar41._M_str = psVar18[1]._M_dataplus._M_p;
                  bVar41._M_len = psVar18[1]._M_string_length;
                  __y._M_str = correct_type_name._M_str;
                  __y._M_len = correct_type_name._M_len;
                  bVar14 = std::operator!=(bVar41,__y);
                  if (!bVar14) goto LAB_0028d630;
                  mark.value.offset_ = (size_t)anon_var_dwarf_6ff9c1;
                  mark.value.guard_.owner_ = (ZeroCopyBufferedStream *)0x4b;
                  absl::lts_20240722::
                  StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            ((string *)
                             &key_1.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             ,(FormatSpec<std::basic_string_view<char>,_std::basic_string_view<char>_>
                               *)&mark,&extn_name,&correct_type_name);
                  JsonLocation::Invalid
                            ((JsonLocation *)this,pJVar3,
                             CONCAT44(key_1.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_1._4_4_,
                                      key_1.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_1._0_4_),
                             CONCAT44(key_1.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_0.status_.rep_._4_4_,
                                      key_1.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_0.status_.rep_._0_4_));
LAB_0028d777:
                  std::__cxx11::string::~string
                            ((string *)
                             &key_1.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                }
                else {
LAB_0028d60e:
                  name_00._M_str = pcVar30;
                  name_00._M_len = (size_t)factory.pool_;
                  oVar37 = Proto2Descriptor::FieldByName
                                     ((Proto2Descriptor *)desc,
                                      (Desc *)factory.super_MessageFactory._vptr_MessageFactory,
                                      name_00);
                  local_260 = oVar37.
                              super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>
                              ._M_payload;
                  uVar36 = oVar37.
                           super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
                           _8_4_;
LAB_0028d630:
                  if ((uVar36 & 1) == 0) {
                    if ((lex->options_).ignore_unknown_fields == false) {
                      extn_name._M_str = (char *)0x13;
                      extn_name._M_len = (size_t)"no such field: \'%s\'";
                      absl::lts_20240722::
                      StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                                ((string *)
                                 &key_1.
                                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 ,(FormatSpec<std::basic_string_view<char>_> *)&extn_name,
                                 (basic_string_view<char,_std::char_traits<char>_> *)&factory);
                      JsonLocation::Invalid
                                ((JsonLocation *)this,pJVar3,
                                 CONCAT44(key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_1._4_4_,
                                          key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_1._0_4_),
                                 CONCAT44(key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_0.status_.rep_._4_4_,
                                          key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_0.status_.rep_._0_4_));
                      goto LAB_0028d777;
                    }
                    JsonLexer::SkipValue((JsonLexer *)this);
                  }
                  else {
                    local_120 = lex->path_;
                    MVar10._vptr_MessageFactory = factory.super_MessageFactory._vptr_MessageFactory;
                    pDVar11 = factory.pool_;
                    bVar4 = (local_260._M_value)->type_;
                    sVar38 = Proto2Descriptor::FieldTypeName(local_260._M_value);
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_0.status_.rep_._0_4_ = ZEXT14(bVar4);
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._0_4_ = sVar38._M_len._0_4_;
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._4_4_ = sVar38._M_len._4_4_;
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._8_8_ = sVar38._M_str;
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._16_8_ = MVar10._vptr_MessageFactory;
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._24_8_ = pDVar11;
                    key_1.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1._32_4_ = 0xffffffff;
                    std::
                    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
                              (&local_120->components_,
                               (Component *)
                               &key_1.
                                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              );
                    pMVar35 = local_120;
                    bVar14 = ParseProto2Descriptor::HasParsed
                                       (local_260._M_value,msg,(lex->options_).allow_legacy_syntax);
                    if ((!bVar14) || (bVar14 = JsonLexer::Peek(lex,kNull), bVar14)) {
                      bVar14 = FieldDescriptor::is_map(local_260._M_value);
                      if (bVar14) {
                        ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                                  ((JsonLexer *)this,
                                   (Field<google::protobuf::json_internal::ParseProto2Descriptor>)
                                   lex,(Msg<google::protobuf::json_internal::ParseProto2Descriptor>
                                        *)local_260._M_value);
                      }
                      else {
                        bVar14 = FieldDescriptor::is_repeated(local_260._M_value);
                        if ((bVar14) &&
                           (((lex->options_).allow_legacy_syntax != true ||
                            (bVar14 = JsonLexer::Peek(lex,kArr), bVar14)))) {
                          ParseArray<google::protobuf::json_internal::ParseProto2Descriptor>
                                    ((JsonLexer *)this,
                                     (Field<google::protobuf::json_internal::ParseProto2Descriptor>)
                                     lex,(Msg<google::protobuf::json_internal::ParseProto2Descriptor>
                                          *)local_260._M_value);
                        }
                        else {
                          ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                                    ((JsonLexer *)this,
                                     (Field<google::protobuf::json_internal::ParseProto2Descriptor>)
                                     lex,(Msg<google::protobuf::json_internal::ParseProto2Descriptor>
                                          *)local_260._M_value);
                        }
                      }
                    }
                    else {
                      extn_name._M_str = (char *)0x41;
                      extn_name._M_len =
                           (size_t)
                           "\'%s\' has already been set (either directly or as part of a oneof)";
                      absl::lts_20240722::
                      StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                                ((string *)
                                 &key_1.
                                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 ,(FormatSpec<std::basic_string_view<char>_> *)&extn_name,
                                 (basic_string_view<char,_std::char_traits<char>_> *)&factory);
                      JsonLocation::Invalid
                                ((JsonLocation *)this,pJVar3,
                                 CONCAT44(key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_1._4_4_,
                                          key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_1._0_4_),
                                 CONCAT44(key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_0.status_.rep_._4_4_,
                                          key_1.
                                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                          .field_0.status_.rep_._0_4_));
                      std::__cxx11::string::~string
                                ((string *)
                                 &key_1.
                                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                );
                    }
                    ppCVar1 = &(pMVar35->components_).
                               super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppCVar1 = *ppCVar1 + -1;
                  }
                }
LAB_0028d85d:
                if (*(long *)this != 1) goto LAB_0028d889;
              }
              absl::lts_20240722::Status::~Status((Status *)this);
              literal_01._M_str = ",";
              literal_01._M_len = 1;
              bVar12 = JsonLexer::Peek(lex,literal_01);
              bVar14 = true;
            }
            else {
              if ((lex->options_).allow_legacy_syntax == true) {
                JsonLexer::ParseBareWord
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&key_1.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           ,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=(&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            ,&key_1.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           );
                goto LAB_0028d390;
              }
              JsonLocation::Invalid((JsonLocation *)this,pJVar3,0xc,"expected \'\"\'");
LAB_0028d889:
              bVar14 = false;
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData(&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           );
            if (!bVar14) {
              return (Status)(uintptr_t)this;
            }
            literal_02._M_str = "}";
            literal_02._M_len = 1;
            bVar14 = JsonLexer::Peek(lex,literal_02);
          } while (!bVar14);
          piVar2 = &(lex->options_).recursion_depth;
          *piVar2 = *piVar2 + 1;
          if (((lex->options_).allow_legacy_syntax == false) && (bVar12 != false)) {
            pcVar30 = "expected \'}\'";
LAB_0028d8e7:
            JsonLocation::Invalid((JsonLocation *)this,pJVar3,0xc,pcVar30);
            return (Status)(uintptr_t)this;
          }
        }
        *(undefined8 *)this = 1;
        return (Status)(uintptr_t)this;
      }
      out = &switchD_0028d2dd::switchdataD_003b1ffc;
      switch(MVar15) {
      case kWrapper:
        pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
        ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                  ((JsonLexer *)this,
                   (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                   (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar16);
        return (Status)(uintptr_t)this;
      default:
        goto switchD_0028d2dd_caseD_3;
      case kList:
        ParseListValue<google::protobuf::json_internal::ParseProto2Descriptor>(this,lex,desc,msg);
        return (Status)(uintptr_t)this;
      case kTimestamp:
        bVar12 = JsonLexer::Peek(lex,kNull);
        if (bVar12) {
LAB_0028d9cb:
          JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
          return (Status)(uintptr_t)this;
        }
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView
                           (&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._0_4_ = sVar38._M_len._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._4_4_ = sVar38._M_len._4_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._0_4_ = sVar38._M_str._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._4_4_ = sVar38._M_str._4_4_;
        if (sVar38._M_len < 0x14) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x1a,"timestamp string too short");
          break;
        }
        end._M_str = pcVar30;
        end._M_len = (size_t)"-";
        oVar22 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x4,1,end);
        if ((oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged &
            oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload != 0) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x15,"bad year in timestamp");
          break;
        }
        end_00._M_str = pcVar30;
        end_00._M_len = (size_t)"-";
        oVar23 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x2,1,end_00);
        _Var34._M_value =
             oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        if (((ulong)oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
            _Var34._M_value == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x16,"bad month in timestamp");
          break;
        }
        end_01._M_str = pcVar30;
        end_01._M_len = (size_t)"T";
        oVar23 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x2,1,end_01);
        if (((ulong)oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
            oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x14,"bad day in timestamp");
          break;
        }
        end_02._M_str = pcVar30;
        end_02._M_len = (size_t)":";
        oVar25 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x2,1,end_02);
        if (((ulong)oVar25.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x16,"bad hours in timestamp");
          break;
        }
        end_03._M_str = pcVar30;
        end_03._M_len = (size_t)":";
        oVar26 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x2,1,end_03);
        if (((ulong)oVar26.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x18,"bad minutes in timestamp");
          break;
        }
        end_04._M_str = pcVar30;
        end_04._M_len = (size_t)"";
        oVar27 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&key_1,(string_view *)0x2,0,end_04);
        if (((ulong)oVar27.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x18,"bad seconds in timestamp");
          break;
        }
        iVar32 = _Var34._M_value + 9;
        if (2 < _Var34._M_value) {
          iVar32 = _Var34._M_value - 3;
        }
        uVar36 = (oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_payload -
                 (uint)(_Var34._M_value < 3)) + 0x12c0;
        oVar28 = TakeNanosAndAdvance((string_view *)&key_1);
        if (((ulong)oVar28.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar30 = "timestamp had bad nanoseconds";
          uStack_280 = 0x1d;
        }
        else {
          lVar17 = CONCAT44(key_1.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_0.status_.rep_._4_4_,
                            key_1.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_0.status_.rep_._0_4_);
          if (lVar17 != 0) {
            local_258._M_value =
                 oVar26.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload;
            x = ((ulong)oVar27.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0xffffffff) +
                (ulong)(local_258._M_value * 0x3c) +
                (ulong)(oVar25.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload * 0xe10) +
                (long)(int)(oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int>._M_payload +
                            uVar36 / 400 + uVar36 * 0x16d + ((uVar36 >> 2) - uVar36 / 100) +
                            (iVar32 * 0xf4ff + 0x301U >> 0xb) + -0x25bab9) * 0x15180;
            cVar13 = *(char *)CONCAT44(key_1.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       .field_1._4_4_,
                                       key_1.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       .field_1._0_4_);
            if (cVar13 == '+') {
              bVar12 = false;
LAB_0028ed7f:
              if (lVar17 == 6) {
                bVar40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&key_1,1,
                                    0xffffffffffffffff);
                key_1.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_0.status_.rep_._0_4_ = bVar40._M_len._0_4_;
                key_1.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_0.status_.rep_._4_4_ = bVar40._M_len._4_4_;
                key_1.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_1._0_4_ = bVar40._M_str._0_4_;
                key_1.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_1._4_4_ = bVar40._M_str._4_4_;
                end_05._M_str = pcVar30;
                end_05._M_len = (size_t)":";
                oVar22 = TakeTimeDigitsWithSuffixAndAdvance
                                   ((anon_unknown_5 *)&key_1,(string_view *)0x2,1,end_05);
                end_06._M_str = pcVar30;
                end_06._M_len = (size_t)"";
                oVar23 = TakeTimeDigitsWithSuffixAndAdvance
                                   ((anon_unknown_5 *)&key_1,(string_view *)0x2,0,end_06);
                if (((ulong)oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
                    ((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,
                             (undefined1 *)
                             ((long)&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1 + 0x30),0x2a,
                             "timestamp offset has bad hours and minutes");
                  break;
                }
                uVar29 = (ulong)((oVar23.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>._M_payload +
                                 oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload * 0x3c) *
                                0x3c);
                uVar31 = -uVar29;
                if (bVar12) {
                  uVar31 = uVar29;
                }
                x = x + uVar31;
LAB_0028ee53:
                pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
                ParseProto2Descriptor::SetInt64(pFVar16,msg,x);
                pFVar16 = Proto2Descriptor::MustHaveField(desc,2);
                ParseProto2Descriptor::SetInt32
                          (pFVar16,msg,
                           oVar28.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>._M_payload);
                goto LAB_0028eb64;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              pcVar30 = "timestamp offset of wrong size.";
              uStack_280 = 0x1f;
            }
            else {
              if (cVar13 == 'Z') {
                if (lVar17 == 1) goto LAB_0028ee53;
              }
              else if (cVar13 == '-') {
                bVar12 = true;
                goto LAB_0028ed7f;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              pcVar30 = "bad timezone offset";
              uStack_280 = 0x13;
            }
            JsonLocation::Invalid
                      ((JsonLocation *)this,
                       (undefined1 *)
                       ((long)&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               .field_1 + 0x30),uStack_280,pcVar30);
            break;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar30 = "timestamp missing timezone offset";
          uStack_280 = 0x21;
        }
        JsonLocation::Invalid
                  ((JsonLocation *)this,
                   (undefined1 *)
                   ((long)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_1 + 0x30),uStack_280,pcVar30);
        break;
      case kDuration:
        bVar12 = JsonLexer::Peek(lex,kNull);
        if (bVar12) goto LAB_0028d9cb;
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        this_00 = &key.
                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   .field_1;
        sVar38 = MaybeOwnedString::AsView(&(this_00->data_).value);
        sVar19 = 0;
        while ((__n = sVar38._M_len, sVar38._M_len != sVar19 &&
               (cVar13 = sVar38._M_str[sVar19],
               out = (uint *)CONCAT71((int7)((ulong)out >> 8),cVar13 != '-'), __n = sVar19,
               cVar13 == '-' || (byte)(cVar13 - 0x30U) < 10))) {
          sVar19 = sVar19 + 1;
        }
        if (__n == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x23,"duration must start with an integer");
          break;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView(&(this_00->data_).value);
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._0_4_ = sVar38._M_len._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._4_4_ = sVar38._M_len._4_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._0_4_ = sVar38._M_str._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._4_4_ = sVar38._M_str._4_4_;
        bVar40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&key_1,0,__n);
        str._M_str = (char *)&extn_name;
        str._M_len = (size_t)bVar40._M_str;
        bVar12 = absl::lts_20240722::SimpleAtoi<long>
                           ((lts_20240722 *)bVar40._M_len,str,(Nonnull<long_*>)out);
        if (bVar12) {
          if (0xffffff6d0c68c3fe < extn_name._M_len - 0x4979cb9e01) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::EnsureOk(&key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            factory._0_16_ = MaybeOwnedString::AsView(&(this_00->data_).value);
            bVar41 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&factory,__n,
                                0xffffffffffffffff);
            key_1.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_0.status_.rep_._0_4_ = bVar41._M_len._0_4_;
            key_1.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_0.status_.rep_._4_4_ = bVar41._M_len._4_4_;
            key_1.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_1._0_4_ = bVar41._M_str._0_4_;
            key_1.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_1._4_4_ = bVar41._M_str._4_4_;
            _Var24 = (_Optional_payload_base<int>)TakeNanosAndAdvance((string_view *)&key_1);
            if (((ulong)_Var24 >> 0x20 & 1) == 0) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              JsonLocation::Invalid
                        ((JsonLocation *)this,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),0x1c,"duration had bad nanoseconds");
              break;
            }
            if (((long)extn_name._M_len < 0) ||
               (prefix_00._M_str = "-", prefix_00._M_len = 1,
               bVar12 = absl::lts_20240722::StartsWith(bVar40,prefix_00), bVar12)) {
              _Var24._M_payload = -_Var24._M_payload._M_value;
              _Var24._4_4_ = 0;
            }
            bVar40._M_len._4_4_ =
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_0.status_.rep_._4_4_;
            bVar40._M_len._0_4_ =
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_0.status_.rep_._0_4_;
            bVar40._M_str._0_4_ =
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_1._0_4_;
            bVar40._M_str._4_4_ =
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_1._4_4_;
            __y_00._M_str = "s";
            __y_00._M_len = 1;
            bVar12 = std::operator!=(bVar40,__y_00);
            if (bVar12) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              JsonLocation::Invalid
                        ((JsonLocation *)this,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),0x23,"duration must end with a single \'s\'");
              break;
            }
            pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
            ParseProto2Descriptor::SetInt64(pFVar16,msg,extn_name._M_len);
            pFVar16 = Proto2Descriptor::MustHaveField(desc,2);
            ParseProto2Descriptor::SetInt32(pFVar16,msg,_Var24._M_payload._M_value);
            goto LAB_0028eb64;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar30 = "duration out of range";
          uStack_280 = 0x15;
        }
        else {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar30 = "duration had bad seconds";
          uStack_280 = 0x18;
        }
        JsonLocation::Invalid
                  ((JsonLocation *)this,
                   (undefined1 *)
                   ((long)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_1 + 0x30),uStack_280,pcVar30);
        break;
      case kFieldMask:
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView
                           (&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
        if (sVar38._M_len != 0) {
          pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
          correct_type_name = sVar38;
          absl::lts_20240722::strings_internal::
          Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::begin((const_iterator *)&key_1,
                  (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)&correct_type_name);
          absl::lts_20240722::strings_internal::
          Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::end((const_iterator *)&factory,
                (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&correct_type_name);
          while ((uVar9 = key_1.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          .field_1._16_8_,
                 uVar8 = key_1.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         .field_1._8_8_,
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_1._0_4_ != (int)factory.pool_ ||
                 ((_func_int **)
                  CONCAT44(key_1.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_0.status_.rep_._4_4_,
                           key_1.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_0.status_.rep_._0_4_) !=
                  factory.super_MessageFactory._vptr_MessageFactory))) {
            extn_name._M_str = (char *)0x0;
            extn_name._M_len = (size_t)local_148;
            local_148[0] = '\0';
            std::__cxx11::string::reserve((ulong)&extn_name);
            for (lVar17 = 0; uVar8 != lVar17; lVar17 = lVar17 + 1) {
              cVar13 = *(char *)(uVar9 + lVar17);
              cVar33 = (char)&extn_name;
              if ((9 < (byte)(cVar13 - 0x30U)) && (cVar13 != '.' && 0x19 < (byte)(cVar13 + 0x9fU)))
              {
                if ((byte)(cVar13 + 0xbfU) < 0x1a) {
                  std::__cxx11::string::push_back(cVar33);
                }
                else if ((lex->options_).allow_legacy_syntax == false) {
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,
                             (undefined1 *)
                             ((long)&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1 + 0x30),0x21,"unexpected character in FieldMask");
                  std::__cxx11::string::~string((string *)&extn_name);
                  goto LAB_0028eb6f;
                }
              }
              std::__cxx11::string::push_back(cVar33);
            }
            x_01._M_str = pcVar30;
            x_01._M_len = extn_name._M_len;
            ParseProto2Descriptor::SetString
                      ((ParseProto2Descriptor *)pFVar16,(Field)msg,(Msg *)extn_name._M_str,x_01);
            std::__cxx11::string::~string((string *)&extn_name);
            absl::lts_20240722::strings_internal::
            SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator++((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&key_1);
          }
        }
LAB_0028eb64:
        *(undefined8 *)this = 1;
      }
LAB_0028eb6f:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
      return (Status)(uintptr_t)this;
    }
    JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    JsonLexer::BeginMark(&mark,lex);
    local_128 = false;
    JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) goto LAB_0028e895;
    absl::lts_20240722::Status::~Status((Status *)this);
    JsonLexer::Push((JsonLexer *)this);
    if (*(long *)this != 1) goto LAB_0028e895;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal_00._M_str = "}";
    literal_00._M_len = 1;
    bVar12 = JsonLexer::Peek(lex,literal_00);
    if (bVar12) {
      piVar2 = &(lex->options_).recursion_depth;
      *piVar2 = *piVar2 + 1;
LAB_0028cfd7:
      *(undefined8 *)this = 1;
    }
    else {
      bVar12 = true;
      local_248 = "expected \',\'";
      do {
        if (bVar12 == false) goto LAB_0028e182;
        JsonLexer::SkipToToken((JsonLexer *)this);
        if (*(long *)this != 1) goto LAB_0028e895;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&key_1.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
        if ((cVar13 == '\"') ||
           (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
          JsonLexer::ParseUtf8
                    ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     ,lex);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::operator=(&key_1.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      ,&key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
LAB_0028dfcc:
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         );
          absl::lts_20240722::Status::Status
                    ((Status *)this,
                     (Status *)
                     &key_1.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          if (*(long *)this != 1) goto LAB_0028e133;
          absl::lts_20240722::Status::~Status((Status *)this);
          JsonLexer::Expect((JsonLexer *)this,lex,1,":");
          if (*(long *)this != 1) goto LAB_0028e133;
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key_1.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          bVar14 = json_internal::operator==
                             (&key_1.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               .field_1.data_.value,(char (*) [6])"@type");
          if (bVar14) {
            if (local_128 == true) {
              JsonLocation::Invalid
                        ((JsonLocation *)this,
                         (undefined1 *)
                         ((long)&key_1.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),0x15,"repeated @type in Any");
            }
            else {
              JsonLexer::ParseUtf8
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,lex);
              absl::lts_20240722::Status::Status
                        ((Status *)this,
                         (Status *)
                         &key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              if (*(long *)this == 1) {
                absl::lts_20240722::Status::~Status((Status *)this);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::EnsureOk(&key.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          );
                std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                          ((optional<google::protobuf::json_internal::MaybeOwnedString> *)&extn_name
                           ,&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
                *(undefined8 *)this = 1;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData(&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             );
            }
          }
          else {
            JsonLexer::SkipValue((JsonLexer *)this);
          }
          if (*(long *)this != 1) goto LAB_0028e133;
          absl::lts_20240722::Status::~Status((Status *)this);
          literal_03._M_str = ",";
          literal_03._M_len = 1;
          bVar12 = JsonLexer::Peek(lex,literal_03);
          bVar14 = true;
        }
        else {
          if ((lex->options_).allow_legacy_syntax == true) {
            JsonLexer::ParseBareWord
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=(&key_1.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        ,&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       );
            goto LAB_0028dfcc;
          }
          JsonLocation::Invalid((JsonLocation *)this,&lex->json_loc_,0xc,"expected \'\"\'");
LAB_0028e133:
          bVar14 = false;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData(&key_1.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       );
        if (!bVar14) goto LAB_0028e198;
        literal_04._M_str = "}";
        literal_04._M_len = 1;
        bVar14 = JsonLexer::Peek(lex,literal_04);
      } while (!bVar14);
      piVar2 = &(lex->options_).recursion_depth;
      *piVar2 = *piVar2 + 1;
      if (((lex->options_).allow_legacy_syntax != false) || (bVar12 == false)) goto LAB_0028cfd7;
      local_248 = "expected \'}\'";
LAB_0028e182:
      JsonLocation::Invalid((JsonLocation *)this,&lex->json_loc_,0xc,local_248);
LAB_0028e198:
      if (*(long *)this != 1) goto LAB_0028e895;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    Mark::UpToUnread((MaybeOwnedString *)&key,&mark.value,0);
    sVar38 = MaybeOwnedString::AsView((MaybeOwnedString *)&key);
    MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&key);
    io::ArrayInputStream::ArrayInputStream(&in,sVar38._M_str,(int)sVar38._M_len,-1);
    local_1c8 = lex->path_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.col._4_4_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = ZEXT816(0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._36_4_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._40_1_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.offset = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.line = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.col._0_1_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.path = (MessagePath *)*(undefined8 *)&lex->options_;
    uVar5 = *(undefined4 *)&(lex->options_).allow_legacy_syntax;
    local_1e0 = (undefined4)mark.loc.offset;
    uStack_1dc = mark.loc.offset._4_4_;
    uStack_1d8 = (undefined4)mark.loc.line;
    uStack_1d4 = mark.loc.line._4_4_;
    local_1d0 = mark.loc.col;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                )&in;
    local_1c0 = local_1c8;
    if (local_128 == false) {
      if ((lex->options_).allow_legacy_syntax == false) {
        JsonLocation::Invalid((JsonLocation *)this,&mark.loc,0x14,"missing @type in Any");
      }
      else {
        JsonLexer::Expect((JsonLexer *)this,&key,1,"{");
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          JsonLexer::Push((JsonLexer *)this);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            literal_05._M_str = "}";
            literal_05._M_len = 1;
            bVar12 = JsonLexer::Peek((JsonLexer *)&key,literal_05);
            if (bVar12) {
              key.
              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              .field_1._76_4_ =
                   key.
                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   .field_1._76_4_ + 1;
LAB_0028e28e:
              *(undefined8 *)this = 1;
            }
            else {
              bVar12 = true;
              do {
                if (bVar12 == false) {
                  pcVar30 = "expected \',\'";
                  goto LAB_0028ebcf;
                }
                JsonLexer::SkipToToken((JsonLexer *)this);
                if (*(long *)this != 1) goto LAB_0028e887;
                absl::lts_20240722::Status::~Status((Status *)this);
                absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&key_1.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          );
                cVar13 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)&key);
                local_1e8 = SUB41(uVar5,0);
                if ((cVar13 == '\"') ||
                   (cVar13 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)&key),
                   cVar13 == '\'')) {
                  JsonLexer::ParseUtf8
                            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)&factory,(JsonLexer *)&key);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::operator=(&key_1.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)&factory);
LAB_0028e93f:
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)&factory);
                  absl::lts_20240722::Status::Status
                            ((Status *)this,
                             (Status *)
                             &key_1.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  if (*(long *)this != 1) goto LAB_0028ea17;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  JsonLexer::Expect((JsonLexer *)this,(JsonLexer *)&key,1,":");
                  if (*(long *)this != 1) goto LAB_0028ea17;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key_1.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,&mark.loc,0x48,
                             "in legacy mode, missing @type in Any is only allowed for an empty object"
                            );
                  if (*(long *)this != 1) goto LAB_0028ea17;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  literal_06._M_str = ",";
                  literal_06._M_len = 1;
                  bVar12 = JsonLexer::Peek((JsonLexer *)&key,literal_06);
                  bVar14 = true;
                }
                else {
                  if (local_1e8 == true) {
                    JsonLexer::ParseBareWord
                              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)&factory,(JsonLexer *)&key);
                    absl::lts_20240722::internal_statusor::
                    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ::operator=(&key_1.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                  *)&factory);
                    goto LAB_0028e93f;
                  }
                  JsonLocation::Invalid((JsonLocation *)this,&local_1e0,0xc,"expected \'\"\'");
LAB_0028ea17:
                  bVar14 = false;
                }
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData(&key_1.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               );
                if (!bVar14) goto LAB_0028ebe3;
                literal_07._M_str = "}";
                literal_07._M_len = 1;
                bVar14 = JsonLexer::Peek((JsonLexer *)&key,literal_07);
              } while (!bVar14);
              key.
              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              .field_1._76_4_ =
                   key.
                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   .field_1._76_4_ + 1;
              if ((local_1e8 != false) || (bVar12 == false)) goto LAB_0028e28e;
              pcVar30 = "expected \'}\'";
LAB_0028ebcf:
              JsonLocation::Invalid((JsonLocation *)this,&local_1e0,0xc,pcVar30);
LAB_0028ebe3:
              if (*(long *)this != 1) goto LAB_0028e887;
            }
            absl::lts_20240722::Status::~Status((Status *)this);
            *(undefined8 *)this = 1;
          }
        }
      }
    }
    else {
      pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
      sVar38 = MaybeOwnedString::AsView((MaybeOwnedString *)&extn_name);
      x_00._M_str = pcVar30;
      x_00._M_len = (size_t)sVar38._M_str;
      ParseProto2Descriptor::SetString
                ((ParseProto2Descriptor *)pFVar16,(Field)msg,(Msg *)sVar38._M_len,x_00);
      pFVar16 = Proto2Descriptor::MustHaveField(desc,2);
      psVar18 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)&extn_name);
      ParseProto2Descriptor::RecordAsSeen(pFVar16,msg);
      pDVar20 = pFVar16->containing_type_;
      lVar17 = std::__cxx11::string::rfind((char)psVar18,0x2f);
      if (lVar17 + 1U < 2) {
        sVar38 = absl::lts_20240722::NullSafeStringView
                           ("@type must contain at least one / and a nonempty host; got: ");
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._0_4_ = sVar38._M_len._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0.status_.rep_._4_4_ = sVar38._M_len._4_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._0_4_ = sVar38._M_str._0_4_;
        key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._4_4_ = sVar38._M_str._4_4_;
        factory.pool_ = (DescriptorPool *)(psVar18->_M_dataplus)._M_p;
        factory.super_MessageFactory._vptr_MessageFactory = (_func_int **)psVar18->_M_string_length;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&correct_type_name,(AlphaNum *)&key_1);
        absl::lts_20240722::InvalidArgumentError
                  (this,correct_type_name._M_str,correct_type_name._M_len);
        this_02 = &correct_type_name;
      }
      else {
        local_60._M_str = (psVar18->_M_dataplus)._M_p;
        local_60._M_len = psVar18->_M_string_length;
        local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_60,lVar17 + 1U,0xffffffffffffffff);
        pDVar20 = DescriptorPool::FindMessageTypeByName(pDVar20->file_->pool_,local_60);
        if (pDVar20 != (Descriptor *)0x0) {
          DynamicMessageFactory::DynamicMessageFactory(&factory);
          pMVar21 = DynamicMessageFactory::GetPrototype(&factory,pDVar20);
          this_01 = &Message::New(pMVar21)->super_MessageLite;
          pMVar35 = local_1c0;
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_0.status_.rep_._0_4_ = SUB84(this_01,0);
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_0.status_.rep_._4_4_ = (undefined4)((ulong)this_01 >> 0x20);
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1._0_4_ = 1;
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1._4_4_ = 0;
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1._8_8_ = 0;
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1._32_8_ = 1;
          key_1.
          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          .field_1.data_.value.token_.owner_ = (BufferingGuard)(ZeroCopyBufferedStream *)0x0;
          correct_type_name._M_len._0_4_ = 0xb;
          correct_type_name._M_str = (char *)pDVar20->all_names_[1]._M_string_length;
          std::
          vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
          ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
                    (&local_1c0->components_,(Component *)&correct_type_name);
          ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
                    (this,(JsonLexer *)&key,pDVar20,
                     (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)&key_1,true);
          ppCVar1 = &(pMVar35->components_).
                     super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + -1;
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            bVar12 = FieldDescriptor::is_repeated(pFVar16);
            if (bVar12) {
              MVar39 = Message::GetMetadata(msg->msg_);
              pMVar21 = msg->msg_;
              MessageLite::SerializePartialAsString_abi_cxx11_((string *)&correct_type_name,this_01)
              ;
              Reflection::AddString(MVar39.reflection,pMVar21,pFVar16,(string *)&correct_type_name);
            }
            else {
              MVar39 = Message::GetMetadata(msg->msg_);
              pMVar21 = msg->msg_;
              MessageLite::SerializePartialAsString_abi_cxx11_((string *)&correct_type_name,this_01)
              ;
              Reflection::SetString(MVar39.reflection,pMVar21,pFVar16,(string *)&correct_type_name);
            }
            std::__cxx11::string::~string((string *)&correct_type_name);
            *(undefined8 *)this = 1;
          }
          ParseProto2Descriptor::Msg::~Msg((Msg *)&key_1);
          if (this_01 != (MessageLite *)0x0) {
            (*this_01->_vptr_MessageLite[1])(this_01);
          }
          DynamicMessageFactory::~DynamicMessageFactory(&factory);
          goto LAB_0028e887;
        }
        factory.pool_ = (DescriptorPool *)0x19;
        factory.super_MessageFactory._vptr_MessageFactory =
             (_func_int **)"could not find @type \'%s\'";
        absl::lts_20240722::
        StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ((string *)&key_1,(FormatSpec<std::__cxx11::basic_string<char>_> *)&factory,
                   psVar18);
        absl::lts_20240722::InvalidArgumentError
                  (this,CONCAT44(key_1.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1._4_4_,
                                 key_1.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1._0_4_),
                   CONCAT44(key_1.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_0.status_.rep_._4_4_,
                            key_1.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_0.status_.rep_._0_4_));
        this_02 = (string_view *)&key_1;
      }
      std::__cxx11::string::~string((string *)this_02);
    }
LAB_0028e887:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)
               (key.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_1.data_.value.data_.
                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                .
                super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                .
                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                .
                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                .
                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                .
                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                ._M_u._M_first._M_storage._M_storage + 0x10));
LAB_0028e895:
    std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_reset
              ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
               &extn_name);
    BufferingGuard::~BufferingGuard(&mark.value.guard_);
    return (Status)(uintptr_t)this;
  }
  JsonLexer::PeekKind((JsonLexer *)&key_1);
  absl::lts_20240722::Status::Status((Status *)this,(Status *)&key_1);
  if (*(long *)this != 1) goto LAB_0028e388;
  absl::lts_20240722::Status::~Status((Status *)this);
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&key_1);
  switch(key_1.
         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
         .field_1._0_4_) {
  case 0:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,5);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    ParseProto2Descriptor::RecordAsSeen(pFVar16,msg);
    bVar12 = FieldDescriptor::is_repeated(pFVar16);
    if (bVar12) {
      MVar39 = Message::GetMetadata(msg->msg_);
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )Reflection::AddMessage(MVar39.reflection,msg->msg_,pFVar16,(MessageFactory *)0x0)
      ;
    }
    else {
      MVar39 = Message::GetMetadata(msg->msg_);
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )Reflection::MutableMessage
                             (MVar39.reflection,msg->msg_,pFVar16,(MessageFactory *)0x0);
    }
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = ZEXT816(1);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 1;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._36_4_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._40_1_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._41_7_ = 0;
    pDVar20 = FieldDescriptor::message_type(pFVar16);
    ParseStructValue<google::protobuf::json_internal::ParseProto2Descriptor>
              (this,lex,pDVar20,(Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)&key)
    ;
    goto LAB_0028e379;
  case 1:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,6);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    ParseProto2Descriptor::RecordAsSeen(pFVar16,msg);
    bVar12 = FieldDescriptor::is_repeated(pFVar16);
    if (bVar12) {
      MVar39 = Message::GetMetadata(msg->msg_);
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )Reflection::AddMessage(MVar39.reflection,msg->msg_,pFVar16,(MessageFactory *)0x0)
      ;
    }
    else {
      MVar39 = Message::GetMetadata(msg->msg_);
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )Reflection::MutableMessage
                             (MVar39.reflection,msg->msg_,pFVar16,(MessageFactory *)0x0);
    }
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = ZEXT816(1);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 1;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._36_4_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._40_1_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._41_7_ = 0;
    pDVar20 = FieldDescriptor::message_type(pFVar16);
    ParseListValue<google::protobuf::json_internal::ParseProto2Descriptor>
              (this,lex,pDVar20,(Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)&key)
    ;
LAB_0028e379:
    ParseProto2Descriptor::Msg::~Msg((Msg *)&key);
    break;
  case 2:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,3);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::ParseUtf8(&key,lex);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::EnsureOk(&key.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                );
      psVar18 = MaybeOwnedString::ToString_abi_cxx11_
                          (&key.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_1.data_.value);
      x_02._M_str = pcVar30;
      x_02._M_len = (size_t)(psVar18->_M_dataplus)._M_p;
      ParseProto2Descriptor::SetString
                ((ParseProto2Descriptor *)pFVar16,(Field)msg,(Msg *)psVar18->_M_string_length,x_02);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
LAB_0028e1ec:
      ppCVar1 = &(pMVar35->components_).
                 super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + -1;
      goto switchD_0028d21b_default;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData(&key.
                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   );
    break;
  case 3:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,2);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&key,lex);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::EnsureOk
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)&key);
      ParseProto2Descriptor::SetDouble
                (pFVar16,msg,
                 (double)key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         .field_1._0_8_);
      absl::lts_20240722::Status::~Status((Status *)&key);
      goto LAB_0028e1ec;
    }
    absl::lts_20240722::Status::~Status((Status *)&key);
    break;
  case 4:
  case 5:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,4);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&key_1);
    if (key_1.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_1._0_4_ == 4) {
      JsonLexer::Expect((JsonLexer *)this,lex,4,"true");
    }
    else {
      JsonLexer::Expect((JsonLexer *)this,lex,5,"false");
    }
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto2Descriptor::SetBool
                (pFVar16,msg,
                 key_1.
                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 .field_1._0_4_ == 4);
      goto LAB_0028e1ec;
    }
    break;
  case 6:
    pFVar16 = Proto2Descriptor::MustHaveField(desc,1);
    pMVar35 = lex->path_;
    pcVar6 = (pFVar16->all_names_->_M_dataplus)._M_p;
    sVar7 = pFVar16->all_names_->_M_string_length;
    bVar4 = pFVar16->type_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar16);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._1_3_ = 0;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_1_ = bVar4;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_1_ = SUB81(pcVar6,0);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = sVar7;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto2Descriptor::SetEnum(pFVar16,msg,0);
      goto LAB_0028e1ec;
    }
    break;
  default:
switchD_0028d21b_default:
    *(undefined8 *)this = 1;
    goto LAB_0028e388;
  }
  ppCVar1 = &(pMVar35->components_).
             super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar1 = *ppCVar1 + -1;
LAB_0028e388:
  absl::lts_20240722::Status::~Status((Status *)&key_1);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}